

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

void __thiscall draco::MeshEdgebreakerTraversalDecoder::Done(MeshEdgebreakerTraversalDecoder *this)

{
  bool bVar1;
  uint16_t uVar2;
  DecoderBuffer *in_RDI;
  DecoderBuffer *unaff_retaddr;
  
  bVar1 = DecoderBuffer::bit_decoder_active(in_RDI + 1);
  if (bVar1) {
    DecoderBuffer::EndBitDecoding(unaff_retaddr);
  }
  uVar2 = DecoderBuffer::bitstream_version(in_RDI);
  if (uVar2 < 0x202) {
    DecoderBuffer::EndBitDecoding(unaff_retaddr);
  }
  else {
    RAnsBitDecoder::EndDecoding((RAnsBitDecoder *)(in_RDI + 2));
  }
  return;
}

Assistant:

void Done() {
    if (symbol_buffer_.bit_decoder_active()) {
      symbol_buffer_.EndBitDecoding();
    }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (buffer_.bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
      start_face_buffer_.EndBitDecoding();

    } else
#endif
    {
      start_face_decoder_.EndDecoding();
    }
  }